

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_line_progressed(Parser *this,size_t ahead)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  State *pSVar9;
  csubstr cVar10;
  char *pcStack_78;
  size_t local_70;
  char msg [74];
  
  pSVar9 = this->m_state;
  (pSVar9->pos).super_LineCol.offset = (pSVar9->pos).super_LineCol.offset + ahead;
  uVar5 = (pSVar9->pos).super_LineCol.col + ahead;
  (pSVar9->pos).super_LineCol.col = uVar5;
  if ((pSVar9->line_contents).stripped.len + 1 < uVar5) {
    pcVar7 = "check failed: (m_state->pos.col <= m_state->line_contents.stripped.len+1)";
    pcVar8 = msg;
    for (lVar6 = 0x4a; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pcVar8 = *pcVar7;
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar10.len;
    pcStack_78 = cVar10.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x769f) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x769f) << 0x40,8);
    LVar3.name.str = pcStack_78;
    LVar3.name.len = local_70;
    (*p_Var1)(msg,0x4a,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar9 = this->m_state;
  }
  uVar5 = (pSVar9->line_contents).rem.len;
  if (ahead <= uVar5) {
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,(pSVar9->line_contents).rem.str + ahead,
               uVar5 - ahead);
    (pSVar9->line_contents).rem.str = (char *)msg._0_8_;
    (pSVar9->line_contents).rem.len = msg._8_8_;
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  handle_error(0x20a4ad,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_progressed(size_t ahead)
{
    _c4dbgpf("line[{}] ({} cols) progressed by {}:  col {}-->{}   offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, ahead, m_state->pos.col, m_state->pos.col+ahead, m_state->pos.offset, m_state->pos.offset+ahead);
    m_state->pos.offset += ahead;
    m_state->pos.col += ahead;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col <= m_state->line_contents.stripped.len+1);
    m_state->line_contents.rem = m_state->line_contents.rem.sub(ahead);
}